

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticQuad>::CreateBCGeoBlendEl
          (TPZGeoElRefLess<pzgeom::TPZQuadraticQuad> *this,int side,int bc,TPZVec<int> *mapside)

{
  TPZGeoMesh *pTVar1;
  uint uVar2;
  MElementType MVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  ulong uVar7;
  ulong uVar8;
  TPZGeoElSide me;
  int64_t index;
  TPZManVector<long,_10> nodeindices;
  TPZGeoElSide newelside;
  TPZGeoElSide local_d8;
  undefined1 local_c0 [8];
  TPZManVector<long,_10> local_b8;
  TPZGeoElSide local_48;
  TPZGeoEl *pTVar6;
  
  uVar2 = pztopology::TPZQuadrilateral::NSideNodes(side);
  TPZManVector<long,_10>::TPZManVector(&local_b8,(long)(int)uVar2);
  uVar8 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    lVar5 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))(this,side,uVar8 & 0xffffffff);
    local_b8.super_TPZVec<long>.fStore[mapside->fStore[uVar8]] = lVar5;
  }
  pTVar1 = (this->super_TPZGeoEl).fMesh;
  MVar3 = pztopology::TPZQuadrilateral::Type(side);
  iVar4 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xd])
                    (pTVar1,(ulong)MVar3,&local_b8,(ulong)(uint)bc,local_c0);
  pTVar6 = (TPZGeoEl *)CONCAT44(extraout_var,iVar4);
  local_d8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  local_d8.fGeoEl = &this->super_TPZGeoEl;
  local_d8.fSide = side;
  local_48.fSide = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
  local_48.fSide = local_48.fSide + -1;
  local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  local_48.fGeoEl = pTVar6;
  TPZGeoElSide::InsertConnectivity(&local_48,&local_d8,mapside);
  (**(code **)(*(long *)pTVar6 + 0x78))(pTVar6);
  TPZManVector<long,_10>::~TPZManVector(&local_b8);
  return pTVar6;
}

Assistant:

TPZGeoEl *TPZGeoElRefLess<TGeo>::CreateBCGeoBlendEl(int side,int bc, const TPZVec<int> &mapside)
{
    int sidennodes = TGeo::NSideNodes(side);
    TPZManVector<int64_t> nodeindices(sidennodes);
    int inode;
    for(inode=0; inode<sidennodes; inode++){
        nodeindices[mapside[inode]] = this->SideNodeIndex(side,inode);
    }
    int64_t index;
    
    TPZGeoMesh *mesh = this->Mesh();
    MElementType BCtype = TGeo::Type(side);
    
    TPZGeoEl *newel = mesh->CreateGeoBlendElement(BCtype, nodeindices, bc, index);
    TPZGeoElSide me(this,side);
    TPZGeoElSide newelside(newel,newel->NSides()-1);
    
    newelside.InsertConnectivity(me,mapside);
    newel->Initialize();
    
    return newel;
}